

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O3

size_t adios2::helper::LinearIndexWithEnd(Dims *start,Dims *end,Dims *point,bool isRowMajor)

{
  long *plVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  size_t sVar5;
  undefined7 in_register_00000009;
  long lVar6;
  long lVar7;
  pointer puVar8;
  
  puVar2 = (point->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (point->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((int)CONCAT71(in_register_00000009,isRowMajor) == 0) {
    if (puVar2 != puVar3) {
      lVar6 = 1;
      lVar7 = 0;
      sVar5 = 0;
      do {
        plVar1 = (long *)((long)puVar2 + lVar7);
        lVar4 = *(long *)((long)(start->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar7);
        sVar5 = sVar5 + (*plVar1 - lVar4) * lVar6;
        lVar6 = lVar6 * ((*(long *)((long)(end->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar7) -
                         lVar4) + 1);
        lVar7 = lVar7 + 8;
      } while ((pointer)(plVar1 + 1) != puVar3);
      return sVar5;
    }
  }
  else if (puVar3 != puVar2) {
    lVar6 = 1;
    lVar7 = 0;
    sVar5 = 0;
    do {
      puVar8 = (pointer)((long)puVar3 + lVar7 + -8);
      lVar4 = *(long *)((long)(start->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish + lVar7 + -8);
      sVar5 = sVar5 + (*puVar8 - lVar4) * lVar6;
      lVar6 = lVar6 * ((*(long *)((long)(end->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + lVar7 + -8) -
                       lVar4) + 1);
      lVar7 = lVar7 + -8;
    } while (puVar8 != puVar2);
    return sVar5;
  }
  return 0;
}

Assistant:

size_t LinearIndexWithEnd(const Dims &start, const Dims &end, const Dims &point,
                          const bool isRowMajor) noexcept
{
    auto lf_RowMajor = [](const Dims &start, const Dims &end, const Dims &point) -> size_t {
        auto sit = start.rbegin();
        auto eit = end.rbegin();
        auto pit = point.rbegin();
        size_t linearIndex = 0;
        size_t product = 1;
        for (; pit != point.rend(); ++pit)
        {
            linearIndex += (*pit - *sit) * product;
            // count = end - start + 1;
            product *= (*eit - *sit + 1);
            ++sit;
            ++eit;
        }
        return linearIndex;
    };

    auto lf_ColumnMajor = [](const Dims &start, const Dims &end, const Dims &point) -> size_t {
        auto sit = start.begin();
        auto eit = end.begin();
        auto pit = point.begin();
        size_t linearIndex = 0;
        size_t product = 1;
        for (; pit != point.end(); ++pit)
        {
            linearIndex += (*pit - *sit) * product;
            // count = end - start + 1;
            product *= (*eit - *sit + 1);
            ++sit;
            ++eit;
        }
        return linearIndex;
    };

    size_t linearIndex = MaxSizeT - 1;

    if (isRowMajor)
    {
        linearIndex = lf_RowMajor(start, end, point);
    }
    else
    {
        linearIndex = lf_ColumnMajor(start, end, point);
    }

    return linearIndex;
}